

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall llama_model::print_info(llama_model *this)

{
  uint64_t uVar1;
  mapped_type *ppcVar2;
  undefined8 uVar3;
  pointer piVar4;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_class_1_0_00000001 print_f;
  char *rope_scaling_type;
  string *psVar12;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd68;
  char *pcVar13;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  undefined1 uVar14;
  key_type *in_stack_fffffffffffffd78;
  map<llama_rope_scaling_type,_const_char_*,_std::less<llama_rope_scaling_type>,_std::allocator<std::pair<const_llama_rope_scaling_type,_const_char_*>_>_>
  *in_stack_fffffffffffffd80;
  llama_model *in_stack_fffffffffffffd88;
  string local_218 [48];
  string local_1d0 [72];
  string local_188 [40];
  undefined1 local_160 [104];
  string local_f8 [52];
  uint32_t in_stack_ffffffffffffff3c;
  function<unsigned_int_(unsigned_int)> *in_stack_ffffffffffffff40;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff48;
  string local_b0 [72];
  string local_68 [48];
  string local_38 [40];
  mapped_type local_10;
  
  ppcVar2 = std::
            map<llama_rope_scaling_type,_const_char_*,_std::less<llama_rope_scaling_type>,_std::allocator<std::pair<const_llama_rope_scaling_type,_const_char_*>_>_>
            ::at(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_10 = *ppcVar2;
  arch_name_abi_cxx11_(in_stack_fffffffffffffd88);
  uVar3 = std::__cxx11::string::c_str();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: arch             = %s\n","print_info",uVar3);
  std::__cxx11::string::~string(local_38);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab_only       = %d\n","print_info",
                     (ulong)(*(byte *)(in_RDI + 0x28) & 1));
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_train      = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x2c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd           = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x30));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer          = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x38));
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__0,void>
              ((function<unsigned_int_(unsigned_int)> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_head           = %s\n","print_info",uVar3);
    std::__cxx11::string::~string(local_68);
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a4740);
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__1,void>
              ((function<unsigned_int_(unsigned_int)> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_head_kv        = %s\n","print_info",uVar3);
    std::__cxx11::string::~string(local_b0);
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a47d7);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_rot            = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x3c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_swa            = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x40));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_swa_pattern    = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x44));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_k    = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x48));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_v    = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x4c));
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__2,void>
              ((function<unsigned_int_(unsigned_int)> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_gqa            = %s\n","print_info",uVar3);
    std::__cxx11::string::~string(local_f8);
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a4930);
    in_stack_fffffffffffffd88 = (llama_model *)local_160;
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__3,void>
              ((function<unsigned_int_(unsigned_int)> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_k_gqa     = %s\n","print_info",uVar3);
    std::__cxx11::string::~string((string *)(local_160 + 0x20));
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a49c7);
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__4,void>
              ((function<unsigned_int_(unsigned_int)> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_v_gqa     = %s\n","print_info",uVar3);
    std::__cxx11::string::~string(local_188);
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a4a5e);
    pcVar13 = "print_info";
    uVar14 = 1;
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x189c),(char *)0x2,
                       "%s: f_norm_eps       = %.1e\n");
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x18a0),(char *)0x2,
                       "%s: f_norm_rms_eps   = %.1e\n",pcVar13);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1914),(char *)0x2,
                       "%s: f_clamp_kqv      = %.1e\n",pcVar13);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1918),(char *)0x2,
                       "%s: f_max_alibi_bias = %.1e\n",pcVar13);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x191c),(char *)0x2,
                       "%s: f_logit_scale    = %.1e\n",pcVar13);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1928),(char *)0x2,
                       "%s: f_attn_scale     = %.1e\n",pcVar13);
    std::function<unsigned_int(unsigned_int)>::function<llama_model::print_info()const::__5,void>
              ((function<unsigned_int_(unsigned_int)> *)CONCAT17(uVar14,in_stack_fffffffffffffd70),
               (anon_class_8_1_8991fb9c *)pcVar13);
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff             = %s\n","print_info",uVar3);
    std::__cxx11::string::~string(local_1d0);
    std::function<unsigned_int_(unsigned_int)>::~function
              ((function<unsigned_int_(unsigned_int)> *)0x4a4c11);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert         = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x50));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_used    = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x54));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: causal attn      = %d\n","print_info",
                       (ulong)(*(byte *)(in_RDI + 0x192c) & 1));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: pooling type     = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x194c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope type        = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1950));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope scaling     = %s\n","print_info",local_10);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x18d8),(char *)0x2,
                       "%s: freq_base_train  = %.1f\n","print_info");
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x18e0),(char *)0x2,
                       "%s: freq_scale_train = %g\n","print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_orig_yarn  = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x18e8));
    pcVar13 = "unknown";
    if ((*(byte *)(in_RDI + 0x29) & 1) != 0) {
      pcVar13 = "yes";
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope_finetuned   = %s\n","print_info",pcVar13);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_conv       = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1900));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_inner      = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1904));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_state      = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1908));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_dt_rank      = %u\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x190c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_dt_b_c_rms   = %d\n","print_info",
                       (ulong)(*(byte *)(in_RDI + 0x1910) & 1));
  }
  psVar12 = local_218;
  type_name_abi_cxx11_(in_stack_fffffffffffffd88);
  uVar3 = std::__cxx11::string::c_str();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: model type       = %s\n","print_info",uVar3,in_R8,
                     in_R9,psVar12);
  std::__cxx11::string::~string(local_218);
  piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::operator->
                     ((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                      0x4a50c8);
  uVar1 = piVar4->n_elements;
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  if ((auVar5._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < 1000000000000.0) {
    piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::operator->
                       ((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                        0x4a519f);
    uVar1 = piVar4->n_elements;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    if ((auVar7._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < 1000000000.0) {
      piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::
               operator->((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                          0x4a524c);
      uVar1 = piVar4->n_elements;
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      if ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < 1000000.0) {
        piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::
                 operator->((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>
                             *)0x4a52f6);
        uVar1 = piVar4->n_elements;
        auVar11._8_4_ = (int)(uVar1 >> 0x20);
        auVar11._0_8_ = uVar1;
        auVar11._12_4_ = 0x45300000;
        llama_log_internal((ggml_log_level)
                           (((auVar11._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.001)
                           ,(char *)0x2,"%s: model params     = %.2f K\n","print_info");
      }
      else {
        piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::
                 operator->((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>
                             *)0x4a5294);
        uVar1 = piVar4->n_elements;
        auVar10._8_4_ = (int)(uVar1 >> 0x20);
        auVar10._0_8_ = uVar1;
        auVar10._12_4_ = 0x45300000;
        llama_log_internal((ggml_log_level)
                           (((auVar10._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06)
                           ,(char *)0x2,"%s: model params     = %.2f M\n","print_info");
      }
    }
    else {
      piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::
               operator->((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                          0x4a51e7);
      uVar1 = piVar4->n_elements;
      auVar8._8_4_ = (int)(uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      llama_log_internal((ggml_log_level)
                         (((auVar8._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-09),
                         (char *)0x2,"%s: model params     = %.2f B\n","print_info");
    }
  }
  else {
    piVar4 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::operator->
                       ((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                        0x4a5114);
    uVar1 = piVar4->n_elements;
    auVar6._8_4_ = (int)(uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    llama_log_internal((ggml_log_level)
                       (((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-12),
                       (char *)0x2,"%s: model params     = %.2f T\n","print_info");
  }
  uVar3 = std::__cxx11::string::c_str();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: general.name     = %s\n","print_info",uVar3);
  if (*(int *)(in_RDI + 4) == 0x2e) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1874));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1880));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1888));
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1890),(char *)0x2,
                       "%s: expert_weights_scale = %.1f\n","print_info");
  }
  if (*(int *)(in_RDI + 4) == 0x2f) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1874));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_lora_q             = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1878));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_lora_kv            = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x187c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_k_mla    = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x5c));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_v_mla    = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x60));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1880));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1888));
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1890),(char *)0x2,
                       "%s: expert_weights_scale = %.1f\n","print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_norm  = %d\n","print_info",
                       (ulong)(*(byte *)(in_RDI + 0x1894) & 1));
    pcVar13 = llama_expert_gating_func_name(*(llama_expert_gating_func_type *)(in_RDI + 0x1898));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_gating_func   = %s\n","print_info",pcVar13);
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x18ec),(char *)0x2,
                       "%s: rope_yarn_log_mul    = %.4f\n","print_info");
  }
  if (*(int *)(in_RDI + 4) == 0x13) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp         = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1880));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_shexp       = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1884));
  }
  if (*(int *)(in_RDI + 4) == 0x16) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp         = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1880));
  }
  if (((*(int *)(in_RDI + 4) == 0x1e) || (*(int *)(in_RDI + 4) == 0x3c)) ||
     (*(int *)(in_RDI + 4) == 0x3d)) {
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1924),(char *)0x2,
                       "%s: f_embedding_scale = %f\n","print_info");
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1920),(char *)0x2,
                       "%s: f_residual_scale  = %f\n","print_info");
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1928),(char *)0x2,
                       "%s: f_attention_scale = %f\n","print_info");
  }
  if (*(int *)(in_RDI + 4) == 0x41) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1874));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1880));
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)*(uint *)(in_RDI + 0x1888));
    llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 0x1890),(char *)0x2,
                       "%s: expert_weights_scale = %.1f\n","print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_norm  = %d\n","print_info",
                       (ulong)(*(byte *)(in_RDI + 0x1894) & 1));
  }
  llama_vocab::print_info((llama_vocab *)0x4a584e);
  return;
}

Assistant:

void llama_model::print_info() const {
    const char * rope_scaling_type = LLAMA_ROPE_SCALING_TYPES.at(hparams.rope_scaling_type_train);

    auto print_f = [](const std::function<uint32_t(uint32_t)> & f, uint32_t n) {
        bool is_var = false;

        std::vector<uint32_t> v;
        for (uint32_t i = 0; i < n; ++i) {
            v.push_back(f(i));
            if (v[i] != v[0]) {
                is_var = true;
            }
        }

        std::stringstream ss;

        if (is_var) {
            ss << "[";
            for (uint32_t i = 0; i < n; ++i) {
                ss << v[i];
                if (i < n - 1) {
                    ss << ", ";
                }
            }
            ss << "]";
        } else {
            ss << v[0];
        }

        return ss.str();
    };

    // hparams
    LLAMA_LOG_INFO("%s: arch             = %s\n",     __func__, arch_name().c_str());
    LLAMA_LOG_INFO("%s: vocab_only       = %d\n",     __func__, hparams.vocab_only);

    if (!hparams.vocab_only) {
        LLAMA_LOG_INFO("%s: n_ctx_train      = %u\n",     __func__, hparams.n_ctx_train);
        LLAMA_LOG_INFO("%s: n_embd           = %u\n",     __func__, hparams.n_embd);
        LLAMA_LOG_INFO("%s: n_layer          = %u\n",     __func__, hparams.n_layer);
        LLAMA_LOG_INFO("%s: n_head           = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_head(il);    }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_head_kv        = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_head_kv(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_rot            = %u\n",     __func__, hparams.n_rot);
        LLAMA_LOG_INFO("%s: n_swa            = %u\n",     __func__, hparams.n_swa);
        LLAMA_LOG_INFO("%s: n_swa_pattern    = %u\n",     __func__, hparams.n_swa_pattern);
        LLAMA_LOG_INFO("%s: n_embd_head_k    = %u\n",     __func__, hparams.n_embd_head_k);
        LLAMA_LOG_INFO("%s: n_embd_head_v    = %u\n",     __func__, hparams.n_embd_head_v);
        LLAMA_LOG_INFO("%s: n_gqa            = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_gqa(il);        }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_embd_k_gqa     = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_embd_k_gqa(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_embd_v_gqa     = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_embd_v_gqa(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: f_norm_eps       = %.1e\n",   __func__, hparams.f_norm_eps);
        LLAMA_LOG_INFO("%s: f_norm_rms_eps   = %.1e\n",   __func__, hparams.f_norm_rms_eps);
        LLAMA_LOG_INFO("%s: f_clamp_kqv      = %.1e\n",   __func__, hparams.f_clamp_kqv);
        LLAMA_LOG_INFO("%s: f_max_alibi_bias = %.1e\n",   __func__, hparams.f_max_alibi_bias);
        LLAMA_LOG_INFO("%s: f_logit_scale    = %.1e\n",   __func__, hparams.f_logit_scale);
        LLAMA_LOG_INFO("%s: f_attn_scale     = %.1e\n",   __func__, hparams.f_attention_scale);
        LLAMA_LOG_INFO("%s: n_ff             = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_ff(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_expert         = %u\n",     __func__, hparams.n_expert);
        LLAMA_LOG_INFO("%s: n_expert_used    = %u\n",     __func__, hparams.n_expert_used);
        LLAMA_LOG_INFO("%s: causal attn      = %d\n",     __func__, hparams.causal_attn);
        LLAMA_LOG_INFO("%s: pooling type     = %d\n",     __func__, hparams.pooling_type);
        LLAMA_LOG_INFO("%s: rope type        = %d\n",     __func__, hparams.rope_type);
        LLAMA_LOG_INFO("%s: rope scaling     = %s\n",     __func__, rope_scaling_type);
        LLAMA_LOG_INFO("%s: freq_base_train  = %.1f\n",   __func__, hparams.rope_freq_base_train);
        LLAMA_LOG_INFO("%s: freq_scale_train = %g\n",     __func__, hparams.rope_freq_scale_train);
        LLAMA_LOG_INFO("%s: n_ctx_orig_yarn  = %u\n",     __func__, hparams.n_ctx_orig_yarn);
        LLAMA_LOG_INFO("%s: rope_finetuned   = %s\n",     __func__, hparams.rope_finetuned ? "yes" : "unknown");
        LLAMA_LOG_INFO("%s: ssm_d_conv       = %u\n",     __func__, hparams.ssm_d_conv);
        LLAMA_LOG_INFO("%s: ssm_d_inner      = %u\n",     __func__, hparams.ssm_d_inner);
        LLAMA_LOG_INFO("%s: ssm_d_state      = %u\n",     __func__, hparams.ssm_d_state);
        LLAMA_LOG_INFO("%s: ssm_dt_rank      = %u\n",     __func__, hparams.ssm_dt_rank);
        LLAMA_LOG_INFO("%s: ssm_dt_b_c_rms   = %d\n",     __func__, hparams.ssm_dt_b_c_rms);
    }

    LLAMA_LOG_INFO("%s: model type       = %s\n",     __func__, type_name().c_str());
    if (pimpl->n_elements >= 1e12) {
        LLAMA_LOG_INFO("%s: model params     = %.2f T\n", __func__, pimpl->n_elements*1e-12);
    } else if (pimpl->n_elements >= 1e9) {
        LLAMA_LOG_INFO("%s: model params     = %.2f B\n", __func__, pimpl->n_elements*1e-9);
    } else if (pimpl->n_elements >= 1e6) {
        LLAMA_LOG_INFO("%s: model params     = %.2f M\n", __func__, pimpl->n_elements*1e-6);
    } else {
        LLAMA_LOG_INFO("%s: model params     = %.2f K\n", __func__, pimpl->n_elements*1e-3);
    }

    // general kv
    LLAMA_LOG_INFO("%s: general.name     = %s\n",    __func__, name.c_str());

    if (arch == LLM_ARCH_DEEPSEEK) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
    }

    if (arch == LLM_ARCH_DEEPSEEK2) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_lora_q             = %d\n",     __func__, hparams.n_lora_q);
        LLAMA_LOG_INFO("%s: n_lora_kv            = %d\n",     __func__, hparams.n_lora_kv);
        LLAMA_LOG_INFO("%s: n_embd_head_k_mla    = %d\n",     __func__, hparams.n_embd_head_k_mla);
        LLAMA_LOG_INFO("%s: n_embd_head_v_mla    = %d\n",     __func__, hparams.n_embd_head_v_mla);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
        LLAMA_LOG_INFO("%s: expert_weights_norm  = %d\n",     __func__, hparams.expert_weights_norm);
        LLAMA_LOG_INFO("%s: expert_gating_func   = %s\n",     __func__, llama_expert_gating_func_name((llama_expert_gating_func_type) hparams.expert_gating_func));
        LLAMA_LOG_INFO("%s: rope_yarn_log_mul    = %.4f\n",   __func__, hparams.rope_yarn_log_mul);
    }

    if (arch == LLM_ARCH_QWEN2MOE) {
        LLAMA_LOG_INFO("%s: n_ff_exp         = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_ff_shexp       = %d\n",     __func__, hparams.n_ff_shexp);
    }

    if (arch == LLM_ARCH_QWEN3MOE) {
        LLAMA_LOG_INFO("%s: n_ff_exp         = %d\n",     __func__, hparams.n_ff_exp);
    }

    if (arch == LLM_ARCH_MINICPM || arch == LLM_ARCH_GRANITE || arch == LLM_ARCH_GRANITE_MOE) {
        LLAMA_LOG_INFO("%s: f_embedding_scale = %f\n", __func__, hparams.f_embedding_scale);
        LLAMA_LOG_INFO("%s: f_residual_scale  = %f\n", __func__, hparams.f_residual_scale);
        LLAMA_LOG_INFO("%s: f_attention_scale = %f\n", __func__, hparams.f_attention_scale);
    }

    if (arch == LLM_ARCH_BAILINGMOE) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
        LLAMA_LOG_INFO("%s: expert_weights_norm  = %d\n",     __func__, hparams.expert_weights_norm);
    }

    vocab.print_info();
}